

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_1::BuiltinInputVariationsCaseInstance::setupDefaultInputs
          (BuiltinInputVariationsCaseInstance *this)

{
  long lVar1;
  undefined8 *puVar2;
  float *pfVar3;
  byte bVar4;
  float colors [24];
  float vertices [24];
  
  bVar4 = 0;
  puVar2 = &DAT_009b36d0;
  pfVar3 = vertices;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pfVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    pfVar3 = pfVar3 + 2;
  }
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,6,vertices);
  if ((this->m_shaderInputTypes & 2) != 0) {
    puVar2 = &DAT_009b3730;
    pfVar3 = colors;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pfVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      pfVar3 = (float *)((long)pfVar3 + ((ulong)bVar4 * -2 + 1) * 8);
    }
    ShaderRenderCaseInstance::addAttribute
              (&this->super_ShaderRenderCaseInstance,1,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,6,colors);
  }
  return;
}

Assistant:

void BuiltinInputVariationsCaseInstance::setupDefaultInputs (void)
{
	const float vertices[] =
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		 0.0f, -1.0f, 0.0f, 1.0f,
		 1.0f, -1.0f, 0.0f, 1.0f,
		 1.0f,  1.0f, 0.0f, 1.0f,
		 0.0f,  1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f
	};

	addAttribute(0u, VK_FORMAT_R32G32B32A32_SFLOAT, deUint32(sizeof(float) * 4), 6, vertices);

	if (m_shaderInputTypes & SHADER_INPUT_VARYING_BIT)
	{
		const float colors[] =
		{
			 0.6f,  0.0f, 0.0f, 1.0f,
			 0.3f,  0.3f, 0.0f, 1.0f,
			 0.0f,  0.6f, 0.0f, 1.0f,
			 0.0f,  0.6f, 0.0f, 1.0f,
			 0.3f,  0.3f, 0.0f, 1.0f,
			 0.6f,  0.0f, 0.0f, 1.0f
		};
		addAttribute(1u, VK_FORMAT_R32G32B32A32_SFLOAT, deUint32(sizeof(float) * 4), 6, colors);
	}
}